

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inject_sleigh.cc
# Opt level: O2

int4 __thiscall
PcodeInjectLibrarySleigh::registerDynamicInject
          (PcodeInjectLibrarySleigh *this,InjectPayload *payload)

{
  pointer ppIVar1;
  pointer ppIVar2;
  InjectPayload *local_10;
  
  ppIVar1 = (this->super_PcodeInjectLibrary).injection.
            super__Vector_base<InjectPayload_*,_std::allocator<InjectPayload_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppIVar2 = (this->super_PcodeInjectLibrary).injection.
            super__Vector_base<InjectPayload_*,_std::allocator<InjectPayload_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_10 = payload;
  std::vector<InjectPayload_*,_std::allocator<InjectPayload_*>_>::push_back
            (&(this->super_PcodeInjectLibrary).injection,&local_10);
  return (int4)((ulong)((long)ppIVar1 - (long)ppIVar2) >> 3);
}

Assistant:

int4 PcodeInjectLibrarySleigh::registerDynamicInject(InjectPayload *payload)

{
  int4 id = injection.size();
  injection.push_back(payload);
  return id;
}